

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::createPerQuads<deqp::gls::GLValue::WrappedType<int>>
                 (int seed,int count,int componentCount,int stride,Primitive primitive,
                 WrappedType<int> min,WrappedType<int> max)

{
  Int val_00;
  char *pcVar1;
  int local_50;
  WrappedType<int> val;
  int componentNdx;
  int quadNdx;
  char *data;
  int quadStride;
  int componentStride;
  deRandom rnd;
  Primitive primitive_local;
  int stride_local;
  int componentCount_local;
  int count_local;
  int seed_local;
  WrappedType<int> max_local;
  WrappedType<int> min_local;
  
  rnd.z = primitive;
  rnd.w = stride;
  deRandom_init((deRandom *)&quadStride,seed);
  if (rnd.w == 0) {
    rnd.w = componentCount * 4;
  }
  data._4_4_ = 0;
  if (rnd.z == 1) {
    data._4_4_ = rnd.w * 6;
  }
  pcVar1 = (char *)operator_new__((long)(count * data._4_4_));
  for (val.m_value = 0; val.m_value < count; val.m_value = val.m_value + 1) {
    for (local_50 = 0; local_50 < componentCount; local_50 = local_50 + 1) {
      val_00 = getRandom<deqp::gls::GLValue::WrappedType<int>>
                         ((deRandom *)&quadStride,min.m_value,max.m_value);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar1 + (long)(local_50 * 4) + (long)(val.m_value * data._4_4_),
                 (WrappedType<int>)val_00.m_value);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar1 + (long)(local_50 * 4) + (long)(int)rnd.w + (long)(val.m_value * data._4_4_)
                 ,(WrappedType<int>)val_00.m_value);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar1 + (long)(local_50 * 4) +
                          (long)(int)(rnd.w << 1) + (long)(val.m_value * data._4_4_),
                 (WrappedType<int>)val_00.m_value);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar1 + (long)(local_50 * 4) +
                          (long)(int)(rnd.w * 3) + (long)(val.m_value * data._4_4_),
                 (WrappedType<int>)val_00.m_value);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar1 + (long)(local_50 * 4) +
                          (long)(int)(rnd.w << 2) + (long)(val.m_value * data._4_4_),
                 (WrappedType<int>)val_00.m_value);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<int>>
                (pcVar1 + (long)(local_50 * 4) +
                          (long)(int)(rnd.w * 5) + (long)(val.m_value * data._4_4_),
                 (WrappedType<int>)val_00.m_value);
    }
  }
  return pcVar1;
}

Assistant:

char* RandomArrayGenerator::createPerQuads (int seed, int count, int componentCount, int stride, Array::Primitive primitive, T min, T max)
{
	deRandom rnd;
	deRandom_init(&rnd, seed);

	int componentStride = sizeof(T);

	if (stride == 0)
		stride = componentStride * componentCount;

	int quadStride = 0;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* data = new char[count * quadStride];

	for (int quadNdx = 0; quadNdx < count; quadNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			T val = getRandom<T>(rnd, min, max);

			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 0 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 1 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 2 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 3 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 4 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 5 + componentStride * componentNdx, val);
		}
	}

	return data;
}